

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple_windows.c
# Opt level: O0

int main(void)

{
  _Bool _Var1;
  uint uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  mfb_update_state state_b;
  mfb_update_state state_a;
  int index;
  float time_y;
  float time_x;
  float dy;
  float dx;
  int y;
  int x;
  int i;
  float time;
  int32_t col;
  uint32_t c;
  float inc;
  uint32_t pallete [512];
  mfb_window *window_b;
  mfb_window *window_a;
  int seed;
  int carry;
  int noise;
  uint in_stack_fffffffffffff798;
  uint in_stack_fffffffffffff79c;
  mfb_update_state in_stack_fffffffffffff7a0;
  mfb_update_state in_stack_fffffffffffff7a4;
  int in_stack_fffffffffffff7a8;
  float in_stack_fffffffffffff7ac;
  int local_844;
  int local_840;
  int local_83c;
  float local_838;
  uint local_830;
  uint auStack_828 [40];
  mfb_window *in_stack_fffffffffffff878;
  uint in_stack_fffffffffffff93c;
  uint in_stack_fffffffffffff940;
  uint in_stack_fffffffffffff944;
  char *in_stack_fffffffffffff948;
  mfb_window *local_20;
  mfb_window *local_18;
  uint local_10;
  
  local_10 = 0xbeef;
  local_18 = mfb_open_ex(in_stack_fffffffffffff948,in_stack_fffffffffffff944,
                         in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
  if (local_18 != (mfb_window *)0x0) {
    mfb_set_active_callback(local_18,active);
    mfb_set_resize_callback(local_18,resize);
    mfb_set_keyboard_callback(local_18,keyboard);
    mfb_set_char_input_callback(local_18,char_input);
    mfb_set_mouse_button_callback(local_18,mouse_btn);
    mfb_set_mouse_move_callback(local_18,mouse_move);
    mfb_set_mouse_scroll_callback(local_18,mouse_scroll);
    mfb_set_user_data(local_18,"Window A");
    mfb_set_viewport((mfb_window *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),
                     in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c,
                     in_stack_fffffffffffff798);
    local_20 = mfb_open_ex(in_stack_fffffffffffff948,in_stack_fffffffffffff944,
                           in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
    if (local_20 != (mfb_window *)0x0) {
      mfb_set_active_callback(local_20,active);
      mfb_set_resize_callback(local_20,resize);
      mfb_set_keyboard_callback(local_20,keyboard);
      mfb_set_char_input_callback(local_20,char_input);
      mfb_set_mouse_button_callback(local_20,mouse_btn);
      mfb_set_mouse_move_callback(local_20,mouse_move);
      mfb_set_mouse_scroll_callback(local_20,mouse_scroll);
      mfb_set_user_data(local_20,"Window B");
      for (local_830 = 0; local_830 < 0x40; local_830 = local_830 + 1) {
        fVar3 = sinf(((float)local_830 * 1.40625 * 3.1415927) / 180.0);
        uVar2 = (uint)(fVar3 * 255.0 + 0.5);
        auStack_828[local_830] = uVar2 << 0x10;
        auStack_828[local_830 + 0x40] = uVar2 << 8 | 0xff0000;
        auStack_828[local_830 + 0x80] = (0xff - uVar2) * 0x10000 | 0xff00;
        auStack_828[local_830 + 0xc0] = uVar2 | 0xff00;
        auStack_828[local_830 + 0x100] = (0xff - uVar2) * 0x100 | 0xff;
        auStack_828[local_830 + 0x140] = uVar2 << 0x10 | 0xff;
        auStack_828[local_830 + 0x180] = 0xff - uVar2 | 0xff0000;
        auStack_828[local_830 + 0x1c0] = (0xff - uVar2) * 0x10000;
      }
      mfb_set_target_fps(10);
      local_838 = 0.0;
      while( true ) {
        if (local_18 != (mfb_window *)0x0) {
          for (local_83c = 0; local_83c < 480000; local_83c = local_83c + 1) {
            uVar2 = local_10 ^ (int)local_10 >> 3;
            local_10 = (uVar2 & 1) << 0x1e | (int)local_10 >> 1;
            uVar2 = (int)uVar2 >> 1 & 0xff;
            g_buffer_a[local_83c] = uVar2 << 0x10 | uVar2 << 8 | uVar2;
          }
          in_stack_fffffffffffff7a4 =
               mfb_update((mfb_window *)
                          CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),
                          (void *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0));
          if (in_stack_fffffffffffff7a4 != STATE_OK) {
            local_18 = (mfb_window *)0x0;
          }
        }
        if (local_20 != (mfb_window *)0x0) {
          fVar3 = sinf((local_838 * 3.1415927) / 180.0);
          in_stack_fffffffffffff7ac = cosf((local_838 * 3.1415927) / 180.0);
          local_83c = 0;
          for (local_844 = 0; local_844 < 0xf0; local_844 = local_844 + 1) {
            fVar4 = cosf(((float)local_844 * in_stack_fffffffffffff7ac * 3.1415927) / 180.0);
            for (local_840 = 0; local_840 < 0x140; local_840 = local_840 + 1) {
              fVar5 = sinf(((float)local_840 * fVar3 * 3.1415927) / 180.0);
              in_stack_fffffffffffff7a8 = (int)((fVar5 + 2.0 + fVar4) * 0.25 * 511.0);
              g_buffer_b[local_83c] = auStack_828[in_stack_fffffffffffff7a8];
              local_83c = local_83c + 1;
            }
          }
          local_838 = local_838 + 0.1;
          in_stack_fffffffffffff7a0 =
               mfb_update((mfb_window *)
                          CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),
                          (void *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0));
          if (in_stack_fffffffffffff7a0 != STATE_OK) {
            local_20 = (mfb_window *)0x0;
          }
        }
        if ((local_18 == (mfb_window *)0x0) && (local_20 == (mfb_window *)0x0)) break;
        if (local_18 == (mfb_window *)0x0) {
          if ((local_20 != (mfb_window *)0x0) &&
             (_Var1 = mfb_wait_sync(in_stack_fffffffffffff878), !_Var1)) {
            local_20 = (mfb_window *)0x0;
          }
        }
        else {
          _Var1 = mfb_wait_sync(in_stack_fffffffffffff878);
          if (!_Var1) {
            local_18 = (mfb_window *)0x0;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int 
main()
{
    int noise, carry, seed = 0xbeef;

    struct mfb_window *window_a = mfb_open_ex("Multiple Windows Test", WIDTH_A, HEIGHT_A, WF_RESIZABLE);
    if (!window_a)
        return 0;

    mfb_set_active_callback(window_a, active);
    mfb_set_resize_callback(window_a, resize);
    mfb_set_keyboard_callback(window_a, keyboard);
    mfb_set_char_input_callback(window_a, char_input);
    mfb_set_mouse_button_callback(window_a, mouse_btn);
    mfb_set_mouse_move_callback(window_a, mouse_move);
    mfb_set_mouse_scroll_callback(window_a, mouse_scroll);

    mfb_set_user_data(window_a, (void *) "Window A");
    mfb_set_viewport(window_a, 25, 25, WIDTH_A-50, HEIGHT_A-50);

    //--
    struct mfb_window *window_b = mfb_open_ex("Secondary Window", WIDTH_B, HEIGHT_B, WF_RESIZABLE);
    if (!window_b)
        return 0;

    mfb_set_active_callback(window_b, active);
    mfb_set_resize_callback(window_b, resize);
    mfb_set_keyboard_callback(window_b, keyboard);
    mfb_set_char_input_callback(window_b, char_input);
    mfb_set_mouse_button_callback(window_b, mouse_btn);
    mfb_set_mouse_move_callback(window_b, mouse_move);
    mfb_set_mouse_scroll_callback(window_b, mouse_scroll);

    mfb_set_user_data(window_b, (void *) "Window B");

    // Generate pallete for plasma effect
    uint32_t    pallete[512];
    float       inc = 90.0f / 64.0f;
    for(uint32_t c=0; c<64; ++c) {
        int32_t col = (int32_t) ((255.0f * sinf(c * inc * kPI / 180.0f)) + 0.5f);
        pallete[64*0 + c] = MFB_RGB(col,     0,       0);
        pallete[64*1 + c] = MFB_RGB(255,     col,     0);
        pallete[64*2 + c] = MFB_RGB(255-col, 255,     0);
        pallete[64*3 + c] = MFB_RGB(0,       255,     col);
        pallete[64*4 + c] = MFB_RGB(0,       255-col, 255);
        pallete[64*5 + c] = MFB_RGB(col,     0,       255);
        pallete[64*6 + c] = MFB_RGB(255,     0,       255-col);
        pallete[64*7 + c] = MFB_RGB(255-col, 0,       0);
    }

    mfb_set_target_fps(10);

    //--
    float   time = 0;
    for (;;)
    {
        int      i, x, y;
        float    dx, dy, time_x, time_y;
        int      index;
        
        mfb_update_state state_a, state_b;

        if(window_a != 0x0) {
            for (i = 0; i < WIDTH_A * HEIGHT_A; ++i)
            {
                noise = seed;
                noise >>= 3;
                noise ^= seed;
                carry = noise & 1;
                noise >>= 1;
                seed >>= 1;
                seed |= (carry << 30);
                noise &= 0xFF;
                g_buffer_a[i] = MFB_RGB(noise, noise, noise); 
            }

            //--
            state_a = mfb_update(window_a, g_buffer_a);
            if (state_a != STATE_OK) {
                window_a = 0x0;
            }
        }

        //--
        if(window_b != 0x0) {
            time_x = sinf(time * kPI / 180.0f);
            time_y = cosf(time * kPI / 180.0f);
            i = 0;
            for(y=0; y<HEIGHT_B; ++y) {
                dy = cosf((y * time_y) * kPI / 180.0f);                // [-1, 1]
                for(x=0; x<WIDTH_B; ++x) {
                    dx = sinf((x * time_x) * kPI / 180.0f);            // [-1, 1]

                    index = (int) ((2.0f + dx + dy) * 0.25f * 511.0f);  // [0, 511]
                    g_buffer_b[i++] = pallete[index];
                }
            }
            time += 0.1f;

            //--
            state_b = mfb_update(window_b, g_buffer_b);
            if (state_b != STATE_OK) {
                window_b = 0x0;
            }
        }

        if(window_a == 0x0 && window_b == 0x0) {
            break;
        }

        // Don't need to do this for both windows in the same thread
        if(window_a != 0x0) {
            if(mfb_wait_sync(window_a) == false) {
                window_a = 0x0;
            }
        }
        else if(window_b != 0x0) {
            if(mfb_wait_sync(window_b) == false) {
                window_b = 0x0;
            }
        }
    }

    return 0;
}